

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O0

CRYPTO_refcount_t * asn1_get_references(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  void *pvVar1;
  ASN1_AUX *aux;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  
  if (it->itype == '\x01') {
    pvVar1 = it->funcs;
    if ((pvVar1 == (void *)0x0) || ((*(uint *)((long)pvVar1 + 8) & 1) == 0)) {
      pval_local = (ASN1_VALUE **)0x0;
    }
    else {
      pval_local = (ASN1_VALUE **)(*pval + *(int *)((long)pvVar1 + 0xc));
    }
  }
  else {
    pval_local = (ASN1_VALUE **)0x0;
  }
  return (CRYPTO_refcount_t *)pval_local;
}

Assistant:

static CRYPTO_refcount_t *asn1_get_references(ASN1_VALUE **pval,
                                              const ASN1_ITEM *it) {
  if (it->itype != ASN1_ITYPE_SEQUENCE) {
    return NULL;
  }
  const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
  if (!aux || !(aux->flags & ASN1_AFLG_REFCOUNT)) {
    return NULL;
  }
  return reinterpret_cast<CRYPTO_refcount_t *>(
      offset2ptr(*pval, aux->ref_offset));
}